

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

bool Diligent::IsConsistentShaderType(SHADER_TYPE ShaderType,PIPELINE_TYPE PipelineType)

{
  Char *Message;
  bool local_53;
  bool local_52;
  bool local_51;
  undefined1 local_38 [8];
  string msg;
  PIPELINE_TYPE PipelineType_local;
  SHADER_TYPE ShaderType_local;
  
  switch(PipelineType) {
  case PIPELINE_TYPE_GRAPHICS:
    local_51 = true;
    if ((((ShaderType != SHADER_TYPE_VERTEX) && (local_51 = true, ShaderType != SHADER_TYPE_HULL))
        && (local_51 = true, ShaderType != SHADER_TYPE_DOMAIN)) &&
       (local_51 = true, ShaderType != SHADER_TYPE_GEOMETRY)) {
      local_51 = ShaderType == SHADER_TYPE_PIXEL;
    }
    PipelineType_local = local_51;
    break;
  case PIPELINE_TYPE_COMPUTE:
    PipelineType_local = ShaderType == SHADER_TYPE_COMPUTE;
    break;
  case PIPELINE_TYPE_MESH:
    local_52 = true;
    if ((ShaderType != SHADER_TYPE_AMPLIFICATION) &&
       (local_52 = true, ShaderType != SHADER_TYPE_MESH)) {
      local_52 = ShaderType == SHADER_TYPE_PIXEL;
    }
    PipelineType_local = local_52;
    break;
  case PIPELINE_TYPE_RAY_TRACING:
    local_53 = true;
    if ((((ShaderType != SHADER_TYPE_RAY_GEN) &&
         (local_53 = true, ShaderType != SHADER_TYPE_RAY_MISS)) &&
        (local_53 = true, ShaderType != SHADER_TYPE_RAY_CLOSEST_HIT)) &&
       ((local_53 = true, ShaderType != SHADER_TYPE_RAY_ANY_HIT &&
        (local_53 = true, ShaderType != SHADER_TYPE_RAY_INTERSECTION)))) {
      local_53 = ShaderType == SHADER_TYPE_CALLABLE;
    }
    PipelineType_local = local_53;
    break;
  case PIPELINE_TYPE_LAST:
    PipelineType_local = ShaderType == SHADER_TYPE_LAST;
    break;
  default:
    msg.field_2._M_local_buf[0xf] = PipelineType;
    FormatString<char[25]>((string *)local_38,(char (*) [25])"Unexpected pipeline type");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"IsConsistentShaderType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x890);
    std::__cxx11::string::~string((string *)local_38);
    PipelineType_local = PIPELINE_TYPE_GRAPHICS;
  }
  return (bool)PipelineType_local;
}

Assistant:

bool IsConsistentShaderType(SHADER_TYPE ShaderType, PIPELINE_TYPE PipelineType)
{
    static_assert(SHADER_TYPE_LAST == 0x4000, "Please update the switch below to handle the new shader type");
    static_assert(PIPELINE_TYPE_LAST == 4, "Please update the switch below to handle the new pipeline type");
    switch (PipelineType)
    {
        case PIPELINE_TYPE_GRAPHICS:
            return ShaderType == SHADER_TYPE_VERTEX ||
                ShaderType == SHADER_TYPE_HULL ||
                ShaderType == SHADER_TYPE_DOMAIN ||
                ShaderType == SHADER_TYPE_GEOMETRY ||
                ShaderType == SHADER_TYPE_PIXEL;

        case PIPELINE_TYPE_COMPUTE:
            return ShaderType == SHADER_TYPE_COMPUTE;

        case PIPELINE_TYPE_MESH:
            return ShaderType == SHADER_TYPE_AMPLIFICATION ||
                ShaderType == SHADER_TYPE_MESH ||
                ShaderType == SHADER_TYPE_PIXEL;

        case PIPELINE_TYPE_RAY_TRACING:
            return ShaderType == SHADER_TYPE_RAY_GEN ||
                ShaderType == SHADER_TYPE_RAY_MISS ||
                ShaderType == SHADER_TYPE_RAY_CLOSEST_HIT ||
                ShaderType == SHADER_TYPE_RAY_ANY_HIT ||
                ShaderType == SHADER_TYPE_RAY_INTERSECTION ||
                ShaderType == SHADER_TYPE_CALLABLE;

        case PIPELINE_TYPE_TILE:
            return ShaderType == SHADER_TYPE_TILE;

        default:
            UNEXPECTED("Unexpected pipeline type");
            return false;
    }
}